

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::
GetMapTypeInternal<duckdb::HistogramFunctor,float,duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType struct_type;
  allocator_type local_b9;
  LogicalType local_b8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  LogicalType local_88 [24];
  string local_70;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(local_50,(LogicalType *)this);
  duckdb::LogicalType::LogicalType(local_88,UBIGINT);
  duckdb::LogicalType::MAP(local_38,local_50,local_88);
  duckdb::LogicalType::~LogicalType(local_88);
  duckdb::LogicalType::~LogicalType(local_50);
  local_70.field_2._M_allocated_capacity = 0x6172676f74736968;
  local_70.field_2._8_2_ = 0x6d;
  local_70._M_string_length = 9;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  duckdb::LogicalType::LogicalType(local_b8,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = local_b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,&local_b9);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_a0,
             local_38,AggregateFunction::
                      StateSize<duckdb::HistogramAggState<float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
             ,AggregateFunction::
              StateInitialize<duckdb::HistogramAggState<float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>,(duckdb::AggregateDestructorType)0>
             ,
             HistogramUpdateFunction<duckdb::HistogramFunctor,float,duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
             ,AggregateFunction::
              StateCombine<duckdb::HistogramAggState<float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>>
             ,
             HistogramFinalizeFunction<duckdb::HistogramFunctor,float,duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
             ,(aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::HistogramAggState<float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  duckdb::LogicalType::~LogicalType(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  duckdb::LogicalType::~LogicalType(local_38);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetMapTypeInternal(const LogicalType &type) {
	return GetHistogramFunction<OP, T, MAP_TYPE>(type);
}